

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logger.cpp
# Opt level: O0

void higan::Logger::SetLogToFile(string *log_dir,string *log_prefix,bool thread_safe)

{
  code *local_e0;
  undefined8 local_d8;
  type local_d0;
  FlushFunction local_b0;
  code *local_80;
  undefined8 local_78;
  type local_70;
  OutputFunction local_50;
  undefined1 local_30 [31];
  bool thread_safe_local;
  string *log_prefix_local;
  string *log_dir_local;
  
  local_30[0x17] = thread_safe;
  unique0x10000188 = log_prefix;
  log_prefix_local = log_dir;
  std::make_shared<higan::LogFile,std::__cxx11::string_const&,std::__cxx11::string_const&,bool&>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30,log_dir,
             (bool *)log_prefix);
  std::shared_ptr<higan::LogFile>::operator=(&g_log_file,(shared_ptr<higan::LogFile> *)local_30);
  std::shared_ptr<higan::LogFile>::~shared_ptr((shared_ptr<higan::LogFile> *)local_30);
  local_80 = LogFile::Append;
  local_78 = 0;
  std::
  bind<void(higan::LogFile::*)(char_const*,unsigned_long),std::shared_ptr<higan::LogFile>&,std::_Placeholder<1>const&,std::_Placeholder<2>const&>
            (&local_70,(offset_in_LogFile_to_subr *)&local_80,&g_log_file,
             (_Placeholder<1> *)&std::placeholders::_1,(_Placeholder<2> *)&std::placeholders::_2);
  std::function<void(char_const*,unsigned_long)>::
  function<std::_Bind<void(higan::LogFile::*(std::shared_ptr<higan::LogFile>,std::_Placeholder<1>,std::_Placeholder<2>))(char_const*,unsigned_long)>,void>
            ((function<void(char_const*,unsigned_long)> *)&local_50,&local_70);
  SetOutputFunction(&local_50);
  std::function<void_(const_char_*,_unsigned_long)>::~function(&local_50);
  std::
  _Bind<void_(higan::LogFile::*(std::shared_ptr<higan::LogFile>,_std::_Placeholder<1>,_std::_Placeholder<2>))(const_char_*,_unsigned_long)>
  ::~_Bind(&local_70);
  local_e0 = LogFile::Flush;
  local_d8 = 0;
  std::bind<void(higan::LogFile::*)(),std::shared_ptr<higan::LogFile>&>
            (&local_d0,(offset_in_LogFile_to_subr *)&local_e0,&g_log_file);
  std::function<void()>::
  function<std::_Bind<void(higan::LogFile::*(std::shared_ptr<higan::LogFile>))()>,void>
            ((function<void()> *)&local_b0,&local_d0);
  SetFlushFunction(&local_b0);
  std::function<void_()>::~function(&local_b0);
  std::_Bind<void_(higan::LogFile::*(std::shared_ptr<higan::LogFile>))()>::~_Bind(&local_d0);
  return;
}

Assistant:

void Logger::SetLogToFile(const std::string& log_dir, const std::string& log_prefix, bool thread_safe)
{
	g_log_file = std::make_shared<LogFile>(log_dir, log_prefix, thread_safe);
	SetOutputFunction(std::bind(&LogFile::Append, g_log_file,
			std::placeholders::_1, std::placeholders::_2));
	SetFlushFunction(std::bind(&LogFile::Flush, g_log_file));
}